

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O1

size_t ecpDetIsZero_deep(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = zzSqrMod_deep(n);
  sVar2 = zzMulMod_deep(n);
  sVar3 = zzMulWMod_deep(n);
  sVar1 = utilMax(3,sVar1,sVar2,sVar3);
  return sVar1 + n * 0x10;
}

Assistant:

size_t ecpDetIsZero_deep(size_t n)
{
	return O_OF_W(2 * n) +
		utilMax(3,
			zzSqrMod_deep(n),
			zzMulMod_deep(n),
			zzMulWMod_deep(n)
		);
}